

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O0

void anon_unknown.dwarf_8b82::FilterForDecimate(double *x,int x_length,int r,double *y)

{
  double dVar1;
  int local_74;
  int i;
  double wt;
  double w [3];
  double local_48;
  double b [2];
  double a [3];
  double *y_local;
  int r_local;
  int x_length_local;
  double *x_local;
  
  switch(r) {
  case 2:
    b[1] = 0.04115673456775719;
    a[0] = -0.42599112459189636;
    a[1] = 0.041037215479961225;
    local_48 = 0.16797464681802227;
    b[0] = 0.5039239404540667;
    break;
  case 3:
    b[1] = 0.9503937898323742;
    a[0] = -0.6742914674152679;
    a[1] = 0.15412211621346475;
    local_48 = 0.07122194517117864;
    b[0] = 0.2136658355135359;
    break;
  case 4:
    b[1] = 1.4499664446880227;
    a[0] = -0.9894349708095058;
    a[1] = 0.24578252340690215;
    local_48 = 0.03671075033932261;
    b[0] = 0.11013225101796784;
    break;
  case 5:
    b[1] = 1.7610939654280557;
    a[0] = -1.2554914843859768;
    a[1] = 0.3237186507788215;
    local_48 = 0.021334858522387423;
    b[0] = 0.06400457556716227;
    break;
  case 6:
    b[1] = 1.971535274951214;
    a[0] = -1.4686795689225347;
    a[1] = 0.3893908434965701;
    local_48 = 0.013469181309343825;
    b[0] = 0.040407543928031475;
    break;
  case 7:
    b[1] = 2.1225239019534703;
    a[0] = -1.6395144861046302;
    a[1] = 0.44469707800587366;
    local_48 = 0.009036688268160842;
    b[0] = 0.027110064804482525;
    break;
  case 8:
    b[1] = 2.2357462340187593;
    a[0] = -1.7780899984041358;
    a[1] = 0.4915255536596869;
    local_48 = 0.006352276340711199;
    b[0] = 0.019056829022133598;
    break;
  case 9:
    b[1] = 2.323600349175958;
    a[0] = -1.8921545617463598;
    a[1] = 0.5314892813372907;
    local_48 = 0.004633116404138937;
    b[0] = 0.013899349212416812;
    break;
  case 10:
    b[1] = 2.3936475118069387;
    a[0] = -1.9873904075111861;
    a[1] = 0.5658879979027055;
    local_48 = 0.0034818622251927556;
    b[0] = 0.010445586675578267;
    break;
  case 0xb:
    b[1] = 2.450743295230728;
    a[0] = -2.06794904601978;
    a[1] = 0.595747744383321;
    local_48 = 0.0026822508007163792;
    b[0] = 0.008046752402149138;
    break;
  case 0xc:
    b[1] = 2.4981398605924205;
    a[0] = -2.1368928194784025;
    a[1] = 0.6218751381622148;
    local_48 = 0.0021097275904709;
    b[0] = 0.0063291827714127;
    break;
  default:
    b[1] = 0.0;
    a[0] = 0.0;
    a[1] = 0.0;
    local_48 = 0.0;
    b[0] = 0.0;
  }
  memset(&wt,0,0x18);
  for (local_74 = 0; local_74 < x_length; local_74 = local_74 + 1) {
    dVar1 = a[1] * w[1] + a[0] * w[0] + b[1] * wt + x[local_74];
    y[local_74] = local_48 * w[1] + b[0] * w[0] + local_48 * dVar1 + b[0] * wt;
    w[1] = w[0];
    w[0] = wt;
    wt = dVar1;
  }
  return;
}

Assistant:

static void FilterForDecimate(const double *x, int x_length, int r, double *y) {
  double a[3], b[2];  // filter Coefficients
  switch (r) {
    case 11:  // fs : 44100 (default)
      a[0] = 2.450743295230728;
      a[1] = -2.06794904601978;
      a[2] = 0.59574774438332101;
      b[0] = 0.0026822508007163792;
      b[1] = 0.0080467524021491377;
      break;
    case 12:  // fs : 48000
      a[0] = 2.4981398605924205;
      a[1] = -2.1368928194784025;
      a[2] = 0.62187513816221485;
      b[0] = 0.0021097275904709001;
      b[1] = 0.0063291827714127002;
      break;
    case 10:
      a[0] = 2.3936475118069387;
      a[1] = -1.9873904075111861;
      a[2] = 0.5658879979027055;
      b[0] = 0.0034818622251927556;
      b[1] = 0.010445586675578267;
      break;
    case 9:
      a[0] = 2.3236003491759578;
      a[1] = -1.8921545617463598;
      a[2] = 0.53148928133729068;
      b[0] = 0.0046331164041389372;
      b[1] = 0.013899349212416812;
      break;
    case 8:  // fs : 32000
      a[0] = 2.2357462340187593;
      a[1] = -1.7780899984041358;
      a[2] = 0.49152555365968692;
      b[0] = 0.0063522763407111993;
      b[1] = 0.019056829022133598;
      break;
    case 7:
      a[0] = 2.1225239019534703;
      a[1] = -1.6395144861046302;
      a[2] = 0.44469707800587366;
      b[0] = 0.0090366882681608418;
      b[1] = 0.027110064804482525;
      break;
    case 6:  // fs : 24000 and 22050
      a[0] = 1.9715352749512141;
      a[1] = -1.4686795689225347;
      a[2] = 0.3893908434965701;
      b[0] = 0.013469181309343825;
      b[1] = 0.040407543928031475;
      break;
    case 5:
      a[0] = 1.7610939654280557;
      a[1] = -1.2554914843859768;
      a[2] = 0.3237186507788215;
      b[0] = 0.021334858522387423;
      b[1] = 0.06400457556716227;
      break;
    case 4:  // fs : 16000
      a[0] = 1.4499664446880227;
      a[1] = -0.98943497080950582;
      a[2] = 0.24578252340690215;
      b[0] = 0.036710750339322612;
      b[1] = 0.11013225101796784;
      break;
    case 3:
      a[0] = 0.95039378983237421;
      a[1] = -0.67429146741526791;
      a[2] = 0.15412211621346475;
      b[0] = 0.071221945171178636;
      b[1] = 0.21366583551353591;
      break;
    case 2:  // fs : 8000
      a[0] = 0.041156734567757189;
      a[1] = -0.42599112459189636;
      a[2] = 0.041037215479961225;
      b[0] = 0.16797464681802227;
      b[1] = 0.50392394045406674;
      break;
    default:
      a[0] = 0.0;
      a[1] = 0.0;
      a[2] = 0.0;
      b[0] = 0.0;
      b[1] = 0.0;
  }

  // Filtering on time domain.
  double w[3] = {0.0, 0.0, 0.0};
  double wt;
  for (int i = 0; i < x_length; ++i) {
    wt = x[i] + a[0] * w[0] + a[1] * w[1] + a[2] * w[2];
    y[i] = b[0] * wt + b[1] * w[0] + b[1] * w[1] + b[0] * w[2];
    w[2] = w[1];
    w[1] = w[0];
    w[0] = wt;
  }
}